

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::Invert(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                 uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uchar *puVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  long lVar8;
  byte bVar9;
  SIMDType SVar10;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  uchar *puVar11;
  uint uVar12;
  undefined4 in_register_0000008c;
  uint uVar13;
  byte *pbVar14;
  byte *pbVar15;
  uchar *puVar16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 in_ZMM0 [64];
  uint local_88;
  uint32_t local_84;
  ImageTemplate<unsigned_char> *local_80;
  uint local_74;
  undefined8 local_70;
  undefined8 local_68;
  ulong local_60;
  ImageTemplate<unsigned_char> local_58;
  
  local_68 = CONCAT44(in_register_0000008c,startYOut);
  local_70 = CONCAT44(in_register_00000014,startYIn);
  local_60 = (ulong)height;
  local_80 = out;
  do {
    SVar10 = simdType;
    bVar9 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                      (in,local_80);
    auVar18 = in_ZMM0._0_32_;
    local_84 = (uint32_t)local_60;
    if (SVar10 != avx_function) {
      if (SVar10 - sse_function < 2) {
        local_88 = 0x10;
        if (0xf < bVar9 * width) goto LAB_00124c83;
      }
      else if (SVar10 != cpu_function) {
        local_88 = 0;
        goto LAB_00124c83;
      }
      Image_Function::Invert
                (in,startXIn,(uint32_t)local_70,local_80,startXOut,(uint32_t)local_68,width,height);
      return;
    }
    simdType = sse_function;
  } while (bVar9 * width < 0x20);
  local_88 = 0x20;
LAB_00124c83:
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,(uint32_t)local_70,local_80,startXOut,(uint32_t)local_68,width,local_84);
  uVar12 = (uint)bVar9;
  local_74 = width * uVar12;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = local_80->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)local_80,src);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_74,&local_84,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar3 = in->_rowSize;
  uVar4 = local_80->_rowSize;
  uVar5 = (ulong)local_74 / (ulong)local_88;
  uVar6 = (ulong)local_74 % (ulong)local_88;
  uVar13 = local_84 * uVar4;
  puVar16 = in->_data + (ulong)(startXIn * uVar12) + (ulong)((int)local_70 * uVar3);
  puVar11 = local_80->_data + (ulong)(startXOut * uVar12) + (ulong)((int)local_68 * uVar4);
  puVar1 = puVar11 + uVar13;
  uVar12 = (int)uVar5 * local_88;
  if (SVar10 == sse_function) {
    if (uVar13 != 0) {
      auVar7 = vpcmpeqd_avx(auVar18._0_16_,auVar18._0_16_);
      do {
        if (local_88 <= local_74) {
          lVar17 = 0;
          do {
            lVar8 = lVar17 + 0x10;
            *(undefined1 (*) [16])(puVar11 + lVar17) =
                 auVar7 ^ *(undefined1 (*) [16])(puVar16 + lVar8 + -0x10);
            lVar17 = lVar17 + 0x10;
          } while (puVar16 + lVar8 != puVar16 + uVar5 * 0x10);
        }
        if (local_74 != uVar12) {
          pbVar14 = puVar11 + uVar12;
          pbVar15 = puVar16 + uVar12;
          pbVar2 = pbVar14 + uVar6;
          do {
            bVar9 = *pbVar15;
            pbVar15 = pbVar15 + 1;
            *pbVar14 = ~bVar9;
            pbVar14 = pbVar14 + 1;
          } while (pbVar14 != pbVar2);
        }
        puVar11 = puVar11 + uVar4;
        puVar16 = puVar16 + uVar3;
      } while (puVar11 != puVar1);
    }
  }
  else if ((SVar10 == avx_function) && (uVar13 != 0)) {
    auVar18 = vpcmpeqd_avx2(auVar18,auVar18);
    do {
      if (local_88 <= local_74) {
        lVar17 = 0;
        do {
          lVar8 = lVar17 + 0x20;
          *(undefined1 (*) [32])(puVar11 + lVar17) =
               auVar18 ^ *(undefined1 (*) [32])(puVar16 + lVar8 + -0x20);
          lVar17 = lVar17 + 0x20;
        } while (puVar16 + lVar8 != puVar16 + uVar5 * 0x20);
      }
      if (local_74 != uVar12) {
        pbVar14 = puVar11 + uVar12;
        pbVar15 = puVar16 + uVar12;
        pbVar2 = pbVar14 + uVar6;
        do {
          bVar9 = *pbVar15;
          pbVar15 = pbVar15 + 1;
          *pbVar14 = ~bVar9;
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 != pbVar2);
      }
      puVar11 = puVar11 + uVar4;
      puVar16 = puVar16 + uVar3;
    } while (puVar11 != puVar1);
  }
  return;
}

Assistant:

void Invert( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }